

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_is_useable(object *obj)

{
  uint uVar1;
  object *obj_local;
  
  uVar1 = (uint)obj->tval;
  if ((uVar1 - 0x16 < 5) || (uVar1 == 0x1c || uVar1 == 0x1d)) {
    obj_local._7_1_ = true;
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool tval_is_useable(const struct object *obj)
{
	switch (obj->tval) {
		case TV_ROD:
		case TV_WAND:
		case TV_STAFF:
		case TV_SCROLL:
		case TV_POTION:
		case TV_FOOD:
		case TV_MUSHROOM:
			return true;
		default:
			return false;
	}
}